

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderConstantVariables.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderConstantVariables::initTest(GeometryShaderConstantVariables *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar6;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
               ,0x8b);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not create VAO!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                    ,0x93);
    GVar4 = (**(code **)(lVar5 + 0x3c8))();
    this->m_program_id = GVar4;
    (**(code **)(lVar5 + 0x14c8))(GVar4,9,&m_feedbackVaryings,0x8c8c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not set program object for transform feedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                    ,0x9c);
    GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_geometry_shader_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar4;
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_program_id,GVar4,1,&m_fragment_shader_code,
                       this->m_geometry_shader_id,1,&m_geometry_shader_code,this->m_vertex_shader_id
                       ,1,&m_vertex_shader_code,(bool *)0x0);
    if (bVar1) {
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_bo_id);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo_id);
      (**(code **)(lVar5 + 0x150))(0x8892,0x24,0,0x88e6);
      (**(code **)(lVar5 + 0x40))(0x8892,0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Could not set a buffer object up",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                      ,0xb0);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Program could not have been created from a valid vertex/geometry/fragment shader!",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
               ,0xa7);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderConstantVariables::initTest(void)
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create VAO */
	gl.genVertexArrays(1, &m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create VAO!");

	/* Create a program object and set it up for TF */
	const unsigned int n_varyings = sizeof(m_feedbackVaryings) / sizeof(m_feedbackVaryings[0]);

	m_program_id = gl.createProgram();

	gl.transformFeedbackVaryings(m_program_id, n_varyings, m_feedbackVaryings, GL_INTERLEAVED_ATTRIBS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set program object for transform feedback");

	/* Create shaders */
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);

	/* Build the test program */
	if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_geometry_shader_id, 1,
					  &m_geometry_shader_code, m_vertex_shader_id, 1, &m_vertex_shader_code))
	{
		TCU_FAIL("Program could not have been created from a valid vertex/geometry/fragment shader!");
	}

	/* Create and set up a buffer object we will use for the test */
	gl.genBuffers(1, &m_bo_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLint) * n_varyings, DE_NULL, GL_STATIC_COPY);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set a buffer object up");
}